

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::HebrewCalendar::handleGetMonthLength
          (HebrewCalendar *this,int32_t extendedYear,int32_t month)

{
  char cVar1;
  int32_t iVar2;
  int local_20;
  int local_1c;
  int32_t month_local;
  int32_t extendedYear_local;
  HebrewCalendar *this_local;
  
  local_1c = extendedYear;
  for (local_20 = month; local_20 < 0; local_20 = iVar2 + local_20) {
    local_1c = local_1c + -1;
    iVar2 = monthsInYear(local_1c);
  }
  for (; 0xc < local_20; local_20 = local_20 - iVar2) {
    iVar2 = monthsInYear(local_1c);
    local_1c = local_1c + 1;
  }
  if (local_20 == 1 || local_20 == 2) {
    iVar2 = yearType(this,local_1c);
    cVar1 = MONTH_LENGTH[local_20][iVar2];
  }
  else {
    cVar1 = MONTH_LENGTH[local_20][0];
  }
  this_local._4_4_ = (int)cVar1;
  return this_local._4_4_;
}

Assistant:

int32_t HebrewCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month) const {
    // Resolve out-of-range months.  This is necessary in order to
    // obtain the correct year.  We correct to
    // a 12- or 13-month year (add/subtract 12 or 13, depending
    // on the year) but since we _always_ number from 0..12, and
    // the leap year determines whether or not month 5 (Adar 1)
    // is present, we allow 0..12 in any given year.
    while (month < 0) {
        month += monthsInYear(--extendedYear);
    }
    // Careful: allow 0..12 in all years
    while (month > 12) {
        month -= monthsInYear(extendedYear++);
    }

    switch (month) {
    case HESHVAN:
    case KISLEV:
      // These two month lengths can vary
      return MONTH_LENGTH[month][yearType(extendedYear)];

    default:
      // The rest are a fixed length
      return MONTH_LENGTH[month][0];
    }
}